

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

void __thiscall miniros::network::NetAddress::NetAddress(NetAddress *this,NetAddress *other)

{
  undefined3 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  *(undefined4 *)in_RDI = 0;
  std::__cxx11::string::string((string *)&in_RDI->_M_string_length);
  *(undefined4 *)&in_RDI[1]._M_string_length = 0;
  in_RDI[1].field_2._M_allocated_capacity = 0;
  std::swap<void*>((void **)&in_RDI[1].field_2._M_allocated_capacity,
                   (void **)&in_RSI[1].field_2._M_allocated_capacity);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(in_RSI,in_RDI);
  *(int *)&in_RDI[1]._M_string_length = (int)in_RSI[1]._M_string_length;
  uVar1 = *(undefined3 *)&in_RSI->field_0x1;
  in_RDI->_M_dataplus = in_RSI->_M_dataplus;
  *(undefined3 *)&in_RDI->field_0x1 = uVar1;
  return;
}

Assistant:

NetAddress::NetAddress(NetAddress&& other) noexcept
{
  std::swap(rawAddress, other.rawAddress);
  std::swap(address, other.address);

  port = other.port;
  type = other.type;
}